

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O0

void __thiscall LinkedObjectFile::disassemble_functions(LinkedObjectFile *this)

{
  bool bVar1;
  reference pvVar2;
  reference pFVar3;
  reference this_00;
  LinkedWord *in_RDI;
  int word;
  Function *function;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int seg;
  value_type *in_stack_fffffffffffffec8;
  vector<Instruction,_std::allocator<Instruction>_> *in_stack_fffffffffffffed0;
  Instruction *in_stack_ffffffffffffff00;
  int local_34;
  __normal_iterator<Function_*,_std::vector<Function,_std::allocator<Function>_>_> local_20;
  undefined4 in_stack_fffffffffffffff0;
  int iVar4;
  LinkedWord *word_00;
  
  word_00 = in_RDI;
  for (iVar4 = 0; iVar4 < *(int *)&in_RDI[1].field_0x28; iVar4 = iVar4 + 1) {
    pvVar2 = std::
             vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
             ::at((vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                   *)in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
    local_20._M_current =
         (Function *)
         std::vector<Function,_std::allocator<Function>_>::begin
                   ((vector<Function,_std::allocator<Function>_> *)in_stack_fffffffffffffec8);
    std::vector<Function,_std::allocator<Function>_>::end
              ((vector<Function,_std::allocator<Function>_> *)in_stack_fffffffffffffec8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<Function_*,_std::vector<Function,_std::allocator<Function>_>_>
                               *)in_stack_fffffffffffffed0,
                              (__normal_iterator<Function_*,_std::vector<Function,_std::allocator<Function>_>_>
                               *)in_stack_fffffffffffffec8), bVar1) {
      pFVar3 = __gnu_cxx::
               __normal_iterator<Function_*,_std::vector<Function,_std::allocator<Function>_>_>::
               operator*(&local_20);
      for (local_34 = pFVar3->start_word; local_34 < pFVar3->end_word; local_34 = local_34 + 1) {
        in_stack_fffffffffffffed0 = &pFVar3->instructions;
        std::
        vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
        ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
              *)in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
        std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                  ((vector<LinkedWord,_std::allocator<LinkedWord>_> *)in_stack_fffffffffffffed0,
                   (size_type)in_stack_fffffffffffffec8);
        decode_instruction(word_00,(LinkedObjectFile *)CONCAT44(iVar4,in_stack_fffffffffffffff0),
                           (int)((ulong)pvVar2 >> 0x20),(int)pvVar2);
        std::vector<Instruction,_std::allocator<Instruction>_>::push_back
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        Instruction::~Instruction(in_stack_ffffffffffffff00);
        this_00 = std::vector<Instruction,_std::allocator<Instruction>_>::back
                            (in_stack_fffffffffffffed0);
        bVar1 = Instruction::is_valid(this_00);
        if (bVar1) {
          *(int *)&in_RDI[1].field_0x1c = *(int *)&in_RDI[1].field_0x1c + 1;
        }
      }
      __gnu_cxx::__normal_iterator<Function_*,_std::vector<Function,_std::allocator<Function>_>_>::
      operator++(&local_20);
    }
  }
  return;
}

Assistant:

void LinkedObjectFile::disassemble_functions() {
  for (int seg = 0; seg < segments; seg++) {
    for (auto& function : functions_by_seg.at(seg)) {
      for (auto word = function.start_word; word < function.end_word; word++) {
        // decode!
        function.instructions.push_back(
            decode_instruction(words_by_seg.at(seg).at(word), *this, seg, word));
        if (function.instructions.back().is_valid()) {
          stats.decoded_ops++;
        }
      }
    }
  }
}